

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdiff.c
# Opt level: O1

int64_t search(int64_t *I,uint8_t *old,int64_t oldsize,uint8_t *new,int64_t newsize,int64_t st,
              int64_t en,int64_t *pos)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  size_t __n;
  long lVar5;
  long lVar6;
  long lVar7;
  
  while (lVar5 = st, 1 < en - lVar5) {
    lVar7 = ((ulong)(en - lVar5) >> 1) + lVar5;
    __n = oldsize - I[lVar7];
    if (newsize <= (long)__n) {
      __n = newsize;
    }
    iVar1 = memcmp(old + I[lVar7],new,__n);
    st = lVar7;
    if (-1 < iVar1) {
      st = lVar5;
      en = lVar7;
    }
  }
  lVar5 = I[lVar5];
  lVar7 = oldsize - lVar5;
  if (newsize <= oldsize - lVar5) {
    lVar7 = newsize;
  }
  if (lVar7 < 1) {
    lVar3 = 0;
  }
  else {
    lVar2 = 0;
    do {
      lVar3 = lVar2;
      if (old[lVar2 + lVar5] != new[lVar2]) break;
      lVar2 = lVar2 + 1;
      lVar3 = lVar7;
    } while (lVar7 != lVar2);
  }
  lVar7 = I[en];
  lVar2 = oldsize - lVar7;
  if (newsize <= oldsize - lVar7) {
    lVar2 = newsize;
  }
  if (lVar2 < 1) {
    lVar4 = 0;
  }
  else {
    lVar6 = 0;
    do {
      lVar4 = lVar6;
      if (old[lVar6 + lVar7] != new[lVar6]) break;
      lVar6 = lVar6 + 1;
      lVar4 = lVar2;
    } while (lVar2 != lVar6);
  }
  if (lVar4 < lVar3) {
    *pos = lVar5;
    lVar4 = lVar3;
  }
  else {
    *pos = lVar7;
  }
  return lVar4;
}

Assistant:

static int64_t search(const int64_t *I,const uint8_t *old,int64_t oldsize,
		const uint8_t *new,int64_t newsize,int64_t st,int64_t en,int64_t *pos)
{
	int64_t x,y;

	if(en-st<2) {
		x=matchlen(old+I[st],oldsize-I[st],new,newsize);
		y=matchlen(old+I[en],oldsize-I[en],new,newsize);

		if(x>y) {
			*pos=I[st];
			return x;
		} else {
			*pos=I[en];
			return y;
		}
	};

	x=st+(en-st)/2;
	if(memcmp(old+I[x],new,MIN(oldsize-I[x],newsize))<0) {
		return search(I,old,oldsize,new,newsize,x,en,pos);
	} else {
		return search(I,old,oldsize,new,newsize,st,x,pos);
	};
}